

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O1

_Bool quest_check(player *p,monster *m)

{
  uint32_t *puVar1;
  ushort uVar2;
  uint uVar3;
  quest *pqVar4;
  player_upkeep *ppVar5;
  loc grid;
  bool bVar6;
  _Bool _Var7;
  bool bVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  bool bVar12;
  loc_conflict new_grid;
  loc local_38;
  
  uVar2 = z_info->quest_max;
  iVar9 = 0;
  bVar8 = false;
  if (uVar2 == 0) {
    bVar12 = true;
  }
  else {
    uVar3 = cave->depth;
    pqVar4 = p->quests;
    lVar10 = 0;
    bVar8 = false;
    do {
      if (((uVar3 == (&pqVar4->level)[lVar10]) &&
          (m->race == *(monster_race **)((long)&pqVar4->race + lVar10))) &&
         (iVar11 = *(int *)((long)&pqVar4->cur_num + lVar10) + 1,
         *(int *)((long)&pqVar4->cur_num + lVar10) = iVar11,
         iVar11 == *(int *)((long)&pqVar4->max_num + lVar10))) {
        (&pqVar4->level)[lVar10] = '\0';
        bVar8 = true;
      }
      iVar9 = (iVar9 + 1) - (uint)((&pqVar4->level)[lVar10] == '\0');
      lVar10 = lVar10 + 0x30;
    } while ((ulong)uVar2 * 0x30 != lVar10);
    bVar12 = iVar9 == 0;
  }
  if (bVar8) {
    grid.x = (m->grid).x;
    grid.y = (m->grid).y;
    local_38.x = (p->grid).x;
    local_38.y = (p->grid).y;
    bVar6 = square_changeable(cave,grid);
    while (((!bVar6 && (_Var7 = square_ispassable(cave,grid), _Var7)) &&
           (_Var7 = square_isdoor(cave,grid), !_Var7))) {
      scatter(cave,&local_38,grid,L'\x01',false);
      grid = local_38;
      bVar6 = square_changeable(cave,local_38);
    }
    push_object(grid);
    msg("A magical staircase appears...");
    square_set_feat(cave,grid,L'\x06');
    ppVar5 = p->upkeep;
    puVar1 = &ppVar5->update;
    *puVar1 = *puVar1 | 0x60;
    if (bVar12) {
      p->total_winner = 1;
      puVar1 = &ppVar5->redraw;
      *(byte *)puVar1 = (byte)*puVar1 | 2;
      msg("*** CONGRATULATIONS ***");
      msg("You have won the game!");
      msg("You may retire (key is shift-q) when you are ready.");
    }
  }
  return bVar8;
}

Assistant:

bool quest_check(struct player *p, const struct monster *m)
{
	int i, total = 0;
	bool completed = false;

	/* Mark quests as complete */
	for (i = 0; i < z_info->quest_max; i++) {
		/* Note completed quests */
		if (cave->depth == p->quests[i].level &&
		    m->race == p->quests[i].race) {
			p->quests[i].cur_num++;

			if (p->quests[i].cur_num == p->quests[i].max_num) {
				p->quests[i].level = 0;
				completed = true;
			}
		}

		/* Count incomplete quests */
		if (p->quests[i].level) total++;
	}

	if (completed) {
		/* Build magical stairs */
		build_quest_stairs(p, m->grid);

		/* Nothing left, game over... */
		if (total == 0) {
			p->total_winner = true;
			p->upkeep->redraw |= (PR_TITLE);
			msg("*** CONGRATULATIONS ***");
			msg("You have won the game!");
			msg("You may retire (key is shift-q) when you are ready.");
		}

		return true;
	} else {
		return false;
	}
}